

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall cppnet::BufferQueue::ReadNotMovePt(BufferQueue *this,char *res,uint32_t len)

{
  int iVar1;
  uint32_t uVar2;
  shared_ptr<cppnet::BufferBlock> temp;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar2 = 0;
  if ((res != (char *)0x0) && (uVar2 = 0, (this->_buffer_list)._size != 0)) {
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &(this->_buffer_list)._head.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    uVar2 = 0;
    while ((local_50._M_ptr != (element_type *)0x0 && (uVar2 < len))) {
      iVar1 = (*((local_50._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[2])
                        (local_50._M_ptr,res + uVar2);
      uVar2 = uVar2 + iVar1;
      if (local_50._M_ptr ==
          (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr) break;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &((local_50._M_ptr)->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_50,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return uVar2;
}

Assistant:

uint32_t BufferQueue::ReadNotMovePt(char* res, uint32_t len) {
    if (_buffer_list.Size() == 0 || !res) {
        return 0;
    }

    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t read_len = 0;
    while (temp && read_len < len) {
        read_len += temp->ReadNotMovePt(res + read_len, len - read_len);
        if (temp == _buffer_write) {
            break;
        }
        temp = temp->GetNext();
    }
    return read_len;
}